

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O0

void blake256_compress(state_conflict *S,uint8_t *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_RSI;
  long in_RDI;
  uint local_9c;
  uint auStack_98 [9];
  uint32_t i;
  uint32_t m [16];
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
    auStack_98[local_9c] =
         (uint)*(byte *)(in_RSI + (ulong)(local_9c << 2)) << 0x18 |
         (uint)*(byte *)(in_RSI + 1 + (ulong)(local_9c << 2)) << 0x10 |
         (uint)*(byte *)(in_RSI + 2 + (ulong)(local_9c << 2)) << 8 |
         (uint)*(byte *)(in_RSI + 3 + (ulong)(local_9c << 2));
  }
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    m[(ulong)local_9c + 6] = *(uint32_t *)(in_RDI + (ulong)local_9c * 4);
  }
  m[0xe] = *(uint *)(in_RDI + 0x20) ^ 0x243f6a88;
  m[0xf] = *(uint *)(in_RDI + 0x24) ^ 0x85a308d3;
  local_30 = *(uint *)(in_RDI + 0x28) ^ 0x13198a2e;
  local_2c = *(uint *)(in_RDI + 0x2c) ^ 0x3707344;
  local_28 = 0xa4093822;
  local_24 = 0x299f31d0;
  local_20 = 0x82efa98;
  local_1c = 0xec4e6c89;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    local_28 = *(uint *)(in_RDI + 0x30) ^ 0xa4093822;
    local_24 = *(uint *)(in_RDI + 0x30) ^ 0x299f31d0;
    local_20 = *(uint *)(in_RDI + 0x34) ^ 0x82efa98;
    local_1c = *(uint *)(in_RDI + 0x34) ^ 0xec4e6c89;
  }
  for (local_9c = 0; local_9c < 0xe; local_9c = local_9c + 1) {
    m[6] = (auStack_98[sigma[local_9c][0]] ^ cst[sigma[local_9c][1]]) + m[10] + m[6];
    uVar1 = (local_28 ^ m[6]) << 0x10 | (local_28 ^ m[6]) >> 0x10;
    m[0xe] = uVar1 + m[0xe];
    m[10] = (m[10] ^ m[0xe]) << 0x14 | (m[10] ^ m[0xe]) >> 0xc;
    m[6] = (auStack_98[sigma[local_9c][1]] ^ cst[sigma[local_9c][0]]) + m[10] + m[6];
    uVar1 = (uVar1 ^ m[6]) << 0x18 | (uVar1 ^ m[6]) >> 8;
    m[0xe] = uVar1 + m[0xe];
    m[10] = (m[10] ^ m[0xe]) << 0x19 | (m[10] ^ m[0xe]) >> 7;
    m[7] = (auStack_98[sigma[local_9c][2]] ^ cst[sigma[local_9c][3]]) + m[0xb] + m[7];
    uVar2 = (local_24 ^ m[7]) << 0x10 | (local_24 ^ m[7]) >> 0x10;
    m[0xf] = uVar2 + m[0xf];
    m[0xb] = (m[0xb] ^ m[0xf]) << 0x14 | (m[0xb] ^ m[0xf]) >> 0xc;
    m[7] = (auStack_98[sigma[local_9c][3]] ^ cst[sigma[local_9c][2]]) + m[0xb] + m[7];
    uVar2 = (uVar2 ^ m[7]) << 0x18 | (uVar2 ^ m[7]) >> 8;
    m[0xf] = uVar2 + m[0xf];
    m[0xb] = (m[0xb] ^ m[0xf]) << 0x19 | (m[0xb] ^ m[0xf]) >> 7;
    m[8] = (auStack_98[sigma[local_9c][4]] ^ cst[sigma[local_9c][5]]) + m[0xc] + m[8];
    uVar3 = (local_20 ^ m[8]) << 0x10 | (local_20 ^ m[8]) >> 0x10;
    local_30 = uVar3 + local_30;
    m[0xc] = (m[0xc] ^ local_30) << 0x14 | (m[0xc] ^ local_30) >> 0xc;
    m[8] = (auStack_98[sigma[local_9c][5]] ^ cst[sigma[local_9c][4]]) + m[0xc] + m[8];
    uVar3 = (uVar3 ^ m[8]) << 0x18 | (uVar3 ^ m[8]) >> 8;
    local_30 = uVar3 + local_30;
    m[0xc] = (m[0xc] ^ local_30) << 0x19 | (m[0xc] ^ local_30) >> 7;
    m[9] = (auStack_98[sigma[local_9c][6]] ^ cst[sigma[local_9c][7]]) + m[0xd] + m[9];
    uVar4 = (local_1c ^ m[9]) << 0x10 | (local_1c ^ m[9]) >> 0x10;
    local_2c = uVar4 + local_2c;
    m[0xd] = (m[0xd] ^ local_2c) << 0x14 | (m[0xd] ^ local_2c) >> 0xc;
    m[9] = (auStack_98[sigma[local_9c][7]] ^ cst[sigma[local_9c][6]]) + m[0xd] + m[9];
    uVar4 = (uVar4 ^ m[9]) << 0x18 | (uVar4 ^ m[9]) >> 8;
    local_2c = uVar4 + local_2c;
    m[0xd] = (m[0xd] ^ local_2c) << 0x19 | (m[0xd] ^ local_2c) >> 7;
    m[9] = (auStack_98[sigma[local_9c][0xe]] ^ cst[sigma[local_9c][0xf]]) + m[10] + m[9];
    uVar3 = (uVar3 ^ m[9]) << 0x10 | (uVar3 ^ m[9]) >> 0x10;
    m[0xf] = uVar3 + m[0xf];
    m[10] = (m[10] ^ m[0xf]) << 0x14 | (m[10] ^ m[0xf]) >> 0xc;
    m[9] = (auStack_98[sigma[local_9c][0xf]] ^ cst[sigma[local_9c][0xe]]) + m[10] + m[9];
    local_20 = (uVar3 ^ m[9]) << 0x18 | (uVar3 ^ m[9]) >> 8;
    m[0xf] = local_20 + m[0xf];
    m[10] = (m[10] ^ m[0xf]) << 0x19 | (m[10] ^ m[0xf]) >> 7;
    m[8] = (auStack_98[sigma[local_9c][0xc]] ^ cst[sigma[local_9c][0xd]]) + m[0xd] + m[8];
    uVar2 = (uVar2 ^ m[8]) << 0x10 | (uVar2 ^ m[8]) >> 0x10;
    m[0xe] = uVar2 + m[0xe];
    m[0xd] = (m[0xd] ^ m[0xe]) << 0x14 | (m[0xd] ^ m[0xe]) >> 0xc;
    m[8] = (auStack_98[sigma[local_9c][0xd]] ^ cst[sigma[local_9c][0xc]]) + m[0xd] + m[8];
    local_24 = (uVar2 ^ m[8]) << 0x18 | (uVar2 ^ m[8]) >> 8;
    m[0xe] = local_24 + m[0xe];
    m[0xd] = (m[0xd] ^ m[0xe]) << 0x19 | (m[0xd] ^ m[0xe]) >> 7;
    m[6] = (auStack_98[sigma[local_9c][8]] ^ cst[sigma[local_9c][9]]) + m[0xb] + m[6];
    uVar2 = (uVar4 ^ m[6]) << 0x10 | (uVar4 ^ m[6]) >> 0x10;
    local_30 = uVar2 + local_30;
    m[0xb] = (m[0xb] ^ local_30) << 0x14 | (m[0xb] ^ local_30) >> 0xc;
    m[6] = (auStack_98[sigma[local_9c][9]] ^ cst[sigma[local_9c][8]]) + m[0xb] + m[6];
    local_1c = (uVar2 ^ m[6]) << 0x18 | (uVar2 ^ m[6]) >> 8;
    local_30 = local_1c + local_30;
    m[0xb] = (m[0xb] ^ local_30) << 0x19 | (m[0xb] ^ local_30) >> 7;
    m[7] = (auStack_98[sigma[local_9c][10]] ^ cst[sigma[local_9c][0xb]]) + m[0xc] + m[7];
    uVar1 = (uVar1 ^ m[7]) << 0x10 | (uVar1 ^ m[7]) >> 0x10;
    local_2c = uVar1 + local_2c;
    m[0xc] = (m[0xc] ^ local_2c) << 0x14 | (m[0xc] ^ local_2c) >> 0xc;
    m[7] = (auStack_98[sigma[local_9c][0xb]] ^ cst[sigma[local_9c][10]]) + m[0xc] + m[7];
    local_28 = (uVar1 ^ m[7]) << 0x18 | (uVar1 ^ m[7]) >> 8;
    local_2c = local_28 + local_2c;
    m[0xc] = (m[0xc] ^ local_2c) << 0x19 | (m[0xc] ^ local_2c) >> 7;
  }
  for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
    *(uint32_t *)(in_RDI + (ulong)(local_9c & 7) * 4) =
         m[(ulong)local_9c + 6] ^ *(uint *)(in_RDI + (ulong)(local_9c & 7) * 4);
  }
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    *(uint *)(in_RDI + (ulong)local_9c * 4) =
         *(uint *)(in_RDI + 0x20 + (ulong)(local_9c & 3) * 4) ^
         *(uint *)(in_RDI + (ulong)local_9c * 4);
  }
  return;
}

Assistant:

void blake256_compress(state *S, const uint8_t *block) {
    uint32_t v[16], m[16], i;

#define ROT(x,n) (((x)<<(32-n))|((x)>>(n)))
#define G(a,b,c,d,e)                                      \
    v[a] += (m[sigma[i][e]] ^ cst[sigma[i][e+1]]) + v[b]; \
    v[d] = ROT(v[d] ^ v[a],16);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c],12);                           \
    v[a] += (m[sigma[i][e+1]] ^ cst[sigma[i][e]])+v[b];   \
    v[d] = ROT(v[d] ^ v[a], 8);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c], 7);

    for (i = 0; i < 16; ++i) m[i] = U8TO32(block + i * 4);
    for (i = 0; i < 8;  ++i) v[i] = S->h[i];
    v[ 8] = S->s[0] ^ 0x243F6A88;
    v[ 9] = S->s[1] ^ 0x85A308D3;
    v[10] = S->s[2] ^ 0x13198A2E;
    v[11] = S->s[3] ^ 0x03707344;
    v[12] = 0xA4093822;
    v[13] = 0x299F31D0;
    v[14] = 0x082EFA98;
    v[15] = 0xEC4E6C89;

    if (S->nullt == 0) {
        v[12] ^= S->t[0];
        v[13] ^= S->t[0];
        v[14] ^= S->t[1];
        v[15] ^= S->t[1];
    }

    for (i = 0; i < 14; ++i) {
        G(0, 4,  8, 12,  0);
        G(1, 5,  9, 13,  2);
        G(2, 6, 10, 14,  4);
        G(3, 7, 11, 15,  6);
        G(3, 4,  9, 14, 14);
        G(2, 7,  8, 13, 12);
        G(0, 5, 10, 15,  8);
        G(1, 6, 11, 12, 10);
    }

    for (i = 0; i < 16; ++i) S->h[i % 8] ^= v[i];
    for (i = 0; i < 8;  ++i) S->h[i] ^= S->s[i % 4];
}